

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ep.c
# Opt level: O0

void nn_ep_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_fsm *local_30;
  nn_ep *ep;
  void *srcptr_local;
  int type_local;
  int src_local;
  nn_fsm *self_local;
  
  local_30 = self;
  if (self == (nn_fsm *)0x0) {
    local_30 = (nn_fsm *)0x0;
  }
  if (src == -2 && type == -3) {
    (*(code *)**(undefined8 **)local_30[1].shutdown_fn)(local_30[1].shutdown_fn);
    *(undefined4 *)&local_30[1].fn = 3;
  }
  else {
    if (*(int *)&local_30[1].fn != 3) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
              (ulong)*(uint *)&local_30[1].fn,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/ep.c"
              ,0x9e);
      fflush(_stderr);
      nn_err_abort();
    }
    if ((src == -2) && (type == 1)) {
      *(undefined4 *)&local_30[1].fn = 1;
      nn_fsm_stopped(local_30,1);
    }
  }
  return;
}

Assistant:

static void nn_ep_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_ep *ep;

    ep = nn_cont (self, struct nn_ep, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        ep->epbase->vfptr->stop (ep->epbase);
        ep->state = NN_EP_STATE_STOPPING;
        return;
    }
    if (nn_slow (ep->state == NN_EP_STATE_STOPPING)) {
        if (src != NN_FSM_ACTION || type != NN_EP_ACTION_STOPPED)
            return;
        ep->state = NN_EP_STATE_IDLE;
        nn_fsm_stopped (&ep->fsm, NN_EP_STOPPED);
        return;
    }

    nn_fsm_bad_state (ep->state, src, type);
}